

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O3

void helper_msa_ilvr_b_mips64(CPUMIPSState_conflict5 *env,uint32_t wd,uint32_t ws,uint32_t wt)

{
  float64 fVar1;
  ulong uVar2;
  fpr_t fVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  
  fVar1 = (env->active_fpu).fpr[ws].fd;
  uVar2 = (env->active_fpu).fpr[wt].fd;
  auVar10._8_6_ = 0;
  auVar10._0_8_ = uVar2;
  auVar10[0xe] = (char)(uVar2 >> 0x38);
  auVar10[0xf] = (char)(fVar1 >> 0x38);
  auVar9._14_2_ = auVar10._14_2_;
  auVar9._8_5_ = 0;
  auVar9._0_8_ = uVar2;
  auVar9[0xd] = (char)(fVar1 >> 0x30);
  auVar8._13_3_ = auVar9._13_3_;
  auVar8._8_4_ = 0;
  auVar8._0_8_ = uVar2;
  auVar8[0xc] = (char)(uVar2 >> 0x30);
  auVar7._12_4_ = auVar8._12_4_;
  auVar7._8_3_ = 0;
  auVar7._0_8_ = uVar2;
  auVar7[0xb] = (char)(fVar1 >> 0x28);
  auVar6._11_5_ = auVar7._11_5_;
  auVar6._8_2_ = 0;
  auVar6._0_8_ = uVar2;
  auVar6[10] = (char)(uVar2 >> 0x28);
  auVar5._10_6_ = auVar6._10_6_;
  auVar5[8] = 0;
  auVar5._0_8_ = uVar2;
  auVar5[9] = (char)(fVar1 >> 0x20);
  auVar4._9_7_ = auVar5._9_7_;
  auVar4[8] = (char)(uVar2 >> 0x20);
  auVar4._0_8_ = uVar2;
  fVar3._8_8_ = auVar4._8_8_;
  fVar3.fd._7_1_ = (char)(fVar1 >> 0x18);
  fVar3.fd._6_1_ = (char)(uVar2 >> 0x18);
  fVar3.fd._5_1_ = (char)(fVar1 >> 0x10);
  fVar3.fd._4_1_ = (char)(uVar2 >> 0x10);
  fVar3.fd._3_1_ = (char)(fVar1 >> 8);
  fVar3.fd._2_1_ = (char)(uVar2 >> 8);
  fVar3._0_1_ = (undefined1)uVar2;
  fVar3.fd._1_1_ = (char)fVar1;
  (env->active_fpu).fpr[wd] = fVar3;
  return;
}

Assistant:

void helper_msa_ilvr_b(CPUMIPSState *env,
                       uint32_t wd, uint32_t ws, uint32_t wt)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    wr_t *pwt = &(env->active_fpu.fpr[wt].wr);

#if defined(HOST_WORDS_BIGENDIAN)
    pwd->b[8]  = pws->b[0];
    pwd->b[9]  = pwt->b[0];
    pwd->b[10] = pws->b[1];
    pwd->b[11] = pwt->b[1];
    pwd->b[12] = pws->b[2];
    pwd->b[13] = pwt->b[2];
    pwd->b[14] = pws->b[3];
    pwd->b[15] = pwt->b[3];
    pwd->b[0]  = pws->b[4];
    pwd->b[1]  = pwt->b[4];
    pwd->b[2]  = pws->b[5];
    pwd->b[3]  = pwt->b[5];
    pwd->b[4]  = pws->b[6];
    pwd->b[5]  = pwt->b[6];
    pwd->b[6]  = pws->b[7];
    pwd->b[7]  = pwt->b[7];
#else
    pwd->b[15] = pws->b[7];
    pwd->b[14] = pwt->b[7];
    pwd->b[13] = pws->b[6];
    pwd->b[12] = pwt->b[6];
    pwd->b[11] = pws->b[5];
    pwd->b[10] = pwt->b[5];
    pwd->b[9]  = pws->b[4];
    pwd->b[8]  = pwt->b[4];
    pwd->b[7]  = pws->b[3];
    pwd->b[6]  = pwt->b[3];
    pwd->b[5]  = pws->b[2];
    pwd->b[4]  = pwt->b[2];
    pwd->b[3]  = pws->b[1];
    pwd->b[2]  = pwt->b[1];
    pwd->b[1]  = pws->b[0];
    pwd->b[0]  = pwt->b[0];
#endif
}